

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::SerializeWithCachedSizes
          (UninterpretedOption *this,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint uVar2;
  Type *value;
  int i;
  int index;
  
  for (index = 0; index < (this->name_).super_RepeatedPtrFieldBase.current_size_; index = index + 1)
  {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                      (&(this->name_).super_RepeatedPtrFieldBase,index);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)value,output);
  }
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->identifier_value_->_M_dataplus)._M_p,
               (int)this->identifier_value_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(3,this->identifier_value_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 4) != 0) {
    internal::WireFormatLite::WriteUInt64(4,this->positive_int_value_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 8) != 0) {
    internal::WireFormatLite::WriteInt64(5,this->negative_int_value_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 0x10) != 0) {
    internal::WireFormatLite::WriteDouble(6,this->double_value_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 0x20) != 0) {
    internal::WireFormatLite::WriteBytes(7,this->string_value_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 0x40) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->aggregate_value_->_M_dataplus)._M_p,
               (int)this->aggregate_value_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(8,this->aggregate_value_,output);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void UninterpretedOption::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (int i = 0; i < this->name_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->name(i), output);
  }

  // optional string identifier_value = 3;
  if (has_identifier_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->identifier_value(), output);
  }

  // optional uint64 positive_int_value = 4;
  if (has_positive_int_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(4, this->positive_int_value(), output);
  }

  // optional int64 negative_int_value = 5;
  if (has_negative_int_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(5, this->negative_int_value(), output);
  }

  // optional double double_value = 6;
  if (has_double_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(6, this->double_value(), output);
  }

  // optional bytes string_value = 7;
  if (has_string_value()) {
    ::google::protobuf::internal::WireFormatLite::WriteBytes(
      7, this->string_value(), output);
  }

  // optional string aggregate_value = 8;
  if (has_aggregate_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      8, this->aggregate_value(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}